

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactnns.h
# Opt level: O2

void __thiscall ExactNNS<float,_KBalls<float>_>::writeResult(ExactNNS<float,_KBalls<float>_> *this)

{
  float fVar1;
  DistData<int> *pDVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>
  *this_00;
  ulong uVar6;
  vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_> tempList;
  DistDataMax<int> kDist;
  string lshboxBenchFileName;
  ofstream lshboxFout;
  byte abStack_210 [480];
  
  std::__cxx11::string::string
            ((string *)&lshboxBenchFileName,"logs/nn.lshbox",(allocator *)&lshboxFout);
  std::ofstream::ofstream(&lshboxFout,(string *)&lshboxBenchFileName,_S_out);
  if ((abStack_210[*(long *)(_lshboxFout + -0x18)] & 5) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"cannot create output file ");
    poVar4 = std::operator<<(poVar4,(string *)&lshboxBenchFileName);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&lshboxFout);
  poVar4 = std::operator<<(poVar4,"\t");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->topK_);
  std::endl<char,std::char_traits<char>>(poVar4);
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->maxHeaps_).
                            super__Vector_base<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->maxHeaps_).
                            super__Vector_base<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&lshboxFout,(int)uVar5);
    std::operator<<(poVar4,"\t");
    this_00 = (this->maxHeaps_).
              super__Vector_base<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>,_std::allocator<std::priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar5;
    tempList.super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tempList.super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tempList.super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while (pDVar2 = &((this_00->c).
                      super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_DistData<int>,
          &((this_00->c).super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish)->super_DistData<int> != pDVar2) {
      kDist.super_DistData<int> = *pDVar2;
      std::
      priority_queue<DistDataMax<int>,_std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,_std::less<DistDataMax<int>_>_>
      ::pop(this_00);
      std::vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>::push_back
                ((vector<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_> *)
                 &tempList.super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>,
                 &kDist);
    }
    uVar6 = (ulong)((long)tempList.
                          super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)tempList.
                         super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
    while( true ) {
      uVar6 = uVar6 - 1;
      if ((int)(uint)uVar6 < 0) break;
      uVar3 = (uint)uVar6 & 0x7fffffff;
      fVar1 = tempList.super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar3].super_DistData<int>.dist_;
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&lshboxFout,
                          tempList.
                          super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar3].super_DistData<int>.data_)
      ;
      poVar4 = std::operator<<(poVar4,"\t");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar1);
      std::operator<<(poVar4,"\t");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&lshboxFout);
    std::_Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>::~_Vector_base
              (&tempList.super__Vector_base<DistDataMax<int>,_std::allocator<DistDataMax<int>_>_>);
  }
  std::ofstream::close();
  poVar4 = std::operator<<((ostream *)&std::cout,"lshbox groundtruth are written into ");
  poVar4 = std::operator<<(poVar4,(string *)&lshboxBenchFileName);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ofstream::~ofstream(&lshboxFout);
  std::__cxx11::string::~string((string *)&lshboxBenchFileName);
  return;
}

Assistant:

void ExactNNS<DataType, KMeansType>::writeResult() {
    string lshboxBenchFileName = "logs/nn.lshbox";
    // lshbox file
    ofstream lshboxFout(lshboxBenchFileName);
    if (!lshboxFout) {
        cout << "cannot create output file " << lshboxBenchFileName << endl;
    }
    lshboxFout << maxHeaps_.size() << "\t" << topK_ << endl;
    for (int query_id = 0; query_id < maxHeaps_.size(); ++query_id) {
        lshboxFout << query_id << "\t";
        priority_queue<DistDataMax<int > >& maxHeap = maxHeaps_[query_id];

        vector<DistDataMax<int> > tempList;
        while (maxHeap.size()>0) {
            DistDataMax<int> kDist = maxHeap.top();
            maxHeap.pop();
            tempList.push_back(kDist);
        }
        for (int i = tempList.size()-1; i >=0 ; --i) {
            DistDataMax<int> kDist = tempList[i];
            lshboxFout << kDist.data() << "\t" << kDist.dist() << "\t";
        }

        lshboxFout << endl;
    }
    lshboxFout.close();
    cout << "lshbox groundtruth are written into " << lshboxBenchFileName << endl;
}